

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullFormatter.h
# Opt level: O2

string * __thiscall
SLogLib::NullFormatter::formatMessage_abi_cxx11_
          (string *__return_storage_ptr__,NullFormatter *this,Message *msg)

{
  ostream *poVar1;
  ostringstream _stream;
  ostringstream local_190 [376];
  
  if ((this->super_AbstractFormatter).mNewLine == Yes) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar1 = std::operator<<((ostream *)local_190,(string *)msg);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)msg);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string formatMessage(const Message& msg) const override
	{
		if(mNewLine == NewLine::Yes)
		{
			std::ostringstream _stream;
			_stream << msg.mUserMessage << std::endl;
			return _stream.str();
		}
		else
		{
			return msg.mUserMessage;
		}
	}